

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

cl_int clGetGLObjectInfo(cl_mem memobj,cl_gl_object_type *gl_object_type,cl_GLuint *gl_object_name)

{
  bool bVar1;
  CLIntercept *this;
  cl_icd_dispatch *pcVar2;
  time_point start;
  SConfig *pSVar3;
  cl_GLuint *in_RDX;
  cl_gl_object_type *in_RSI;
  cl_mem in_RDI;
  cl_int retVal;
  time_point cpuEnd;
  time_point cpuStart;
  uint64_t enqueueCounter;
  CLIntercept *pIntercept;
  cl_kernel in_stack_00000108;
  undefined4 in_stack_00000110;
  cl_int in_stack_00000114;
  char *in_stack_00000118;
  CLIntercept *in_stack_00000120;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff00;
  CLIntercept *in_stack_ffffffffffffff08;
  allocator *paVar4;
  int local_dc;
  duration local_d8;
  char *local_d0;
  allocator local_c1;
  string local_c0 [32];
  CLIntercept *local_a0;
  duration local_98;
  cl_sync_point_khr *in_stack_ffffffffffffff70;
  cl_event *in_stack_ffffffffffffff78;
  cl_int in_stack_ffffffffffffff84;
  char *in_stack_ffffffffffffff88;
  CLIntercept *in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff9f;
  string *in_stack_ffffffffffffffa0;
  CLIntercept *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  time_point in_stack_ffffffffffffffb8;
  duration in_stack_ffffffffffffffc0;
  time_point in_stack_ffffffffffffffc8;
  cl_int local_4;
  
  this = GetIntercept();
  if ((this == (CLIntercept *)0x0) ||
     (pcVar2 = CLIntercept::dispatch(this),
     pcVar2->clGetGLObjectInfo == (cl_api_clGetGLObjectInfo)0x0)) {
    local_dc = 0;
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&local_dc);
    local_4 = -0x26;
  }
  else {
    start.__d.__r = (duration)CLIntercept::getEnqueueCounter(in_stack_ffffffffffffff08);
    pSVar3 = CLIntercept::config(this);
    if ((pSVar3->CallLogging & 1U) != 0) {
      CLIntercept::callLoggingEnter
                (in_stack_00000120,in_stack_00000118,CONCAT44(in_stack_00000114,in_stack_00000110),
                 in_stack_00000108);
    }
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(in_stack_ffffffffffffff00);
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::time_point(in_stack_ffffffffffffff00);
    pSVar3 = CLIntercept::config(this);
    if (((pSVar3->HostPerformanceTiming & 1U) != 0) ||
       (pSVar3 = CLIntercept::config(this), (pSVar3->ChromeCallLogging & 1U) != 0)) {
      in_stack_ffffffffffffffb8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      in_stack_ffffffffffffffc8.__d.__r = in_stack_ffffffffffffffb8.__d.__r;
    }
    pcVar2 = CLIntercept::dispatch(this);
    local_4 = (*pcVar2->clGetGLObjectInfo)(in_RDI,in_RSI,in_RDX);
    pSVar3 = CLIntercept::config(this);
    if (((pSVar3->HostPerformanceTiming & 1U) != 0) ||
       (pSVar3 = CLIntercept::config(this), (pSVar3->ChromeCallLogging & 1U) != 0)) {
      in_stack_ffffffffffffffa8 = (CLIntercept *)std::chrono::_V2::steady_clock::now();
      in_stack_ffffffffffffffc0.__r = (rep)in_stack_ffffffffffffffa8;
      pSVar3 = CLIntercept::config(this);
      if (((pSVar3->HostPerformanceTiming & 1U) != 0) &&
         (bVar1 = CLIntercept::checkHostPerformanceTimingEnqueueLimits(this,(uint64_t)start.__d.__r)
         , bVar1)) {
        std::allocator<char>::allocator();
        local_a0 = (CLIntercept *)in_stack_ffffffffffffffc0.__r;
        local_98 = in_stack_ffffffffffffffc8.__d.__r;
        std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffff88,"",(allocator *)&stack0xffffffffffffff87);
        in_stack_ffffffffffffffc0.__r = (rep)local_a0;
        in_stack_ffffffffffffffc8.__d.__r = (duration)(duration)local_98.__r;
        CLIntercept::updateHostTimingStats
                  (local_a0,(char *)in_stack_ffffffffffffffb8.__d.__r,
                   (string *)CONCAT44(local_4,in_stack_ffffffffffffffb0),start,
                   (time_point)local_98.__r);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
      }
    }
    pSVar3 = CLIntercept::config(this);
    if (((((pSVar3->ErrorLogging & 1U) != 0) ||
         (pSVar3 = CLIntercept::config(this), (pSVar3->ErrorAssert & 1U) != 0)) ||
        (pSVar3 = CLIntercept::config(this), (pSVar3->NoErrors & 1U) != 0)) && (local_4 != 0)) {
      pSVar3 = CLIntercept::config(this);
      if ((pSVar3->ErrorLogging & 1U) != 0) {
        CLIntercept::logError(in_stack_00000120,in_stack_00000118,in_stack_00000114);
      }
      pSVar3 = CLIntercept::config(this);
      if ((pSVar3->ErrorAssert & 1U) != 0) {
        raise(5);
      }
      pSVar3 = CLIntercept::config(this);
      if ((pSVar3->NoErrors & 1U) != 0) {
        local_4 = 0;
      }
    }
    pSVar3 = CLIntercept::config(this);
    if ((pSVar3->CallLogging & 1U) != 0) {
      CLIntercept::callLoggingExit
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                 in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    }
    pSVar3 = CLIntercept::config(this);
    if ((pSVar3->ChromeCallLogging & 1U) != 0) {
      paVar4 = &local_c1;
      std::allocator<char>::allocator();
      local_d8.__r = in_stack_ffffffffffffffc0.__r;
      local_d0 = (char *)in_stack_ffffffffffffffc8.__d.__r;
      std::__cxx11::string::string(local_c0,"",paVar4);
      CLIntercept::chromeCallLoggingExit
                ((CLIntercept *)CONCAT44(local_4,in_stack_ffffffffffffffb0),
                 (char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                 (bool)in_stack_ffffffffffffff9f,(uint64_t)in_stack_ffffffffffffff90,
                 (time_point)local_d8.__r,in_stack_ffffffffffffffb8);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    }
  }
  return local_4;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL CLIRN(clGetGLObjectInfo)(
    cl_mem memobj,
    cl_gl_object_type* gl_object_type,
    cl_GLuint* gl_object_name)
{
    CLIntercept*    pIntercept = GetIntercept();

    // The cl_khr_gl_sharing APIs and especially clGetGLContextInfoKHR are a
    // special-case: they are extension functions but do not necessarily pass
    // a dispatchable object as their first argument and are implemented in
    // the ICD loader and called into via the ICD dispatch table.  This means
    // that we can install it into our core API dispatch table as well and
    // don't need to look it up per-platform.

    if( pIntercept && pIntercept->dispatch().clGetGLObjectInfo )
    {
        GET_ENQUEUE_COUNTER();
        CALL_LOGGING_ENTER();
        HOST_PERFORMANCE_TIMING_START();

        cl_int  retVal = pIntercept->dispatch().clGetGLObjectInfo(
            memobj,
            gl_object_type,
            gl_object_name);

        HOST_PERFORMANCE_TIMING_END();
        CHECK_ERROR( retVal );
        CALL_LOGGING_EXIT( retVal );

        return retVal;
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_MEM_OBJECT);
}